

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ExclusiveJoinPromiseNode::get(ExclusiveJoinPromiseNode *this,ExceptionOrValue *output)

{
  bool bVar1;
  bool local_31;
  Fault local_20;
  Fault f;
  ExceptionOrValue *output_local;
  ExclusiveJoinPromiseNode *this_local;
  
  f.exception = (Exception *)output;
  bVar1 = Branch::get(&this->left,output);
  local_31 = true;
  if (!bVar1) {
    local_31 = Branch::get(&this->right,(ExceptionOrValue *)f.exception);
  }
  if (local_31 == false) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
               ,0x396,FAILED,"left.get(output) || right.get(output)",
               "\"get() called before ready.\"",(char (*) [27])"get() called before ready.");
    Debug::Fault::fatal(&local_20);
  }
  return;
}

Assistant:

void ExclusiveJoinPromiseNode::get(ExceptionOrValue& output) noexcept {
  KJ_REQUIRE(left.get(output) || right.get(output), "get() called before ready.");
}